

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Chapters::~Chapters(Chapters *this)

{
  Chapter *pCVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = this->chapters_count_;
  while (0 < iVar2) {
    this->chapters_count_ = iVar2 - 1U;
    Chapter::Clear(this->chapters_ + (iVar2 - 1U));
    iVar2 = this->chapters_count_;
  }
  pCVar1 = this->chapters_;
  if (pCVar1 != (Chapter *)0x0) {
    if (*(long *)&pCVar1[-1].displays_size_ != 0) {
      lVar3 = *(long *)&pCVar1[-1].displays_size_ * 0x30;
      do {
        Chapter::~Chapter((Chapter *)((long)&pCVar1[-1].id_ + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != 0);
    }
    operator_delete__(&pCVar1[-1].displays_size_);
  }
  this->chapters_ = (Chapter *)0x0;
  return;
}

Assistant:

Chapters::~Chapters() {
  while (chapters_count_ > 0) {
    Chapter& chapter = chapters_[--chapters_count_];
    chapter.Clear();
  }

  delete[] chapters_;
  chapters_ = NULL;
}